

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

Entry * __thiscall
Ptex::v2_2::PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
lockEntriesAndGrowIfNeeded
          (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
           *this,size_t *newMemUsed)

{
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *in_RDI;
  Entry *entries;
  size_t *in_stack_00000050;
  Entry *in_stack_00000058;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>
  *in_stack_00000060;
  Entry *local_18;
  
  local_18 = lockEntries(in_RDI);
  if (in_RDI->_numEntries <= in_RDI->_size << 1) {
    local_18 = grow(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  return local_18;
}

Assistant:

Entry* lockEntriesAndGrowIfNeeded(size_t& newMemUsed)
    {
        Entry* entries = lockEntries();
        if (_size*2 >= _numEntries) {
            entries = grow(entries, newMemUsed);
        }
        return entries;
    }